

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockArraySizeContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  ProgramResourceQueryTestTarget targetGroup_00;
  NodeType NVar1;
  Node *pNVar2;
  TestNode *pTVar3;
  TestContext *pTVar4;
  bool local_9a;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  TestNode *local_50;
  TestCaseGroup *blockGroup_1;
  TestNode *local_38;
  TestCaseGroup *blockGroup;
  ProgramInterface local_28;
  bool namedNonArrayBlock;
  bool isInterfaceBlock;
  ProgramResourceQueryTestTarget queryTarget;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  queryTarget = (ProgramResourceQueryTestTarget)targetGroup;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,PROGRAMINTERFACE_UNIFORM,2);
  pNVar2 = de::
           SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
           ::operator->(parentStructure);
  NVar1 = ResourceDefinition::Node::getType(pNVar2);
  blockGroup._7_1_ = NVar1 == TYPE_INTERFACE_BLOCK;
  local_9a = false;
  if ((bool)blockGroup._7_1_) {
    pNVar2 = de::
             SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             ::get(parentStructure);
    local_9a = false;
    if (((ulong)pNVar2[1]._vptr_Node & 1) != 0) {
      pNVar2 = de::
               SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               ::operator->(parentStructure);
      pNVar2 = ResourceDefinition::Node::getEnclosingNode(pNVar2);
      NVar1 = ResourceDefinition::Node::getType(pNVar2);
      local_9a = NVar1 != TYPE_ARRAY_ELEMENT;
    }
  }
  targetGroup_00 = queryTarget;
  blockGroup._6_1_ = local_9a;
  if (((blockGroup._7_1_ & 1) == 0) || (local_9a != false)) {
    pTVar3 = (TestNode *)operator_new(0x70);
    pTVar4 = gles31::Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,pTVar4,"types","Types");
    local_38 = pTVar3;
    tcu::TestNode::addChild((TestNode *)queryTarget,pTVar3);
    generateVariableCases
              (context,parentStructure,(TestCaseGroup *)local_38,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,2,false);
    generateOpaqueTypeCases
              (context,parentStructure,(TestCaseGroup *)local_38,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,2,false);
    pTVar3 = (TestNode *)operator_new(0x70);
    pTVar4 = gles31::Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,pTVar4,"aggregates","Aggregate types")
    ;
    local_50 = pTVar3;
    tcu::TestNode::addChild((TestNode *)queryTarget,pTVar3);
    pTVar3 = local_50;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    generateBufferBackedVariableAggregateTypeCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,local_28,
               PROGRAMRESOURCEPROP_ARRAY_SIZE,TYPE_FLOAT,&local_70,3);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
    generateBufferBackedVariableAggregateTypeCases
              (context,parentStructure,(TestCaseGroup *)targetGroup_00,local_28,
               PROGRAMRESOURCEPROP_ARRAY_SIZE,TYPE_FLOAT,&local_98,2);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  return;
}

Assistant:

static void generateUniformBlockArraySizeContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_ARRAY_SIZE);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock || namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 2, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 2, false);
		}

		// aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			generateBufferBackedVariableAggregateTypeCases(context, parentStructure, blockGroup, queryTarget.interface, PROGRAMRESOURCEPROP_ARRAY_SIZE, glu::TYPE_FLOAT, "", 3);
		}
	}
	else
	{
		// aggregates
		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, queryTarget.interface, PROGRAMRESOURCEPROP_ARRAY_SIZE, glu::TYPE_FLOAT, "", 2);
	}
}